

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::geometry::makeRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat colorFormat)

{
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  VkAttachmentDescription local_b4;
  VkRenderPassCreateInfo renderPassInfo;
  VkSubpassDescription subpassDescription;
  
  subpassDescription.pDepthStencilAttachment = &depthAttachmentReference;
  renderPassInfo.pAttachments = &local_b4;
  local_b4.flags = 0;
  local_b4.samples = VK_SAMPLE_COUNT_1_BIT;
  local_b4.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_b4.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  local_b4.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  local_b4.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_b4.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_b4.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  renderPassInfo.pSubpasses = &subpassDescription;
  subpassDescription.flags = 0;
  subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDescription.pColorAttachments = &colorAttachmentReference;
  subpassDescription.inputAttachmentCount = 0;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
  renderPassInfo.subpassCount = 1;
  renderPassInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassInfo.pNext = (void *)0x0;
  renderPassInfo.flags = 0;
  renderPassInfo.attachmentCount = 1;
  subpassDescription.pResolveAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.preserveAttachmentCount = 0;
  subpassDescription.pPreserveAttachments = (deUint32 *)0x0;
  renderPassInfo.dependencyCount = 0;
  depthAttachmentReference.attachment = 0xffffffff;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  renderPassInfo.pDependencies = (VkSubpassDependency *)0x0;
  local_b4.format = colorFormat;
  subpassDescription.colorAttachmentCount = renderPassInfo.subpassCount;
  ::vk::createRenderPass
            (__return_storage_ptr__,vk,device,&renderPassInfo,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> makeRenderPass (const DeviceInterface& vk, const VkDevice device, const VkFormat colorFormat)
{
	const VkAttachmentDescription colorAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,				// VkAttachmentDescriptionFlags		flags;
		colorFormat,									// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,							// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,					// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_STORE,					// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,				// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,				// VkAttachmentStoreOp				stencilStoreOp;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL		// VkImageLayout					finalLayout;
	};

	const VkAttachmentReference colorAttachmentReference =
	{
		0u,												// deUint32			attachment;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL		// VkImageLayout	layout;
	};

	const VkAttachmentReference depthAttachmentReference =
	{
		VK_ATTACHMENT_UNUSED,							// deUint32			attachment;
		VK_IMAGE_LAYOUT_UNDEFINED						// VkImageLayout	layout;
	};

	const VkSubpassDescription subpassDescription =
	{
		(VkSubpassDescriptionFlags)0,					// VkSubpassDescriptionFlags		flags;
		VK_PIPELINE_BIND_POINT_GRAPHICS,				// VkPipelineBindPoint				pipelineBindPoint;
		0u,												// deUint32							inputAttachmentCount;
		DE_NULL,										// const VkAttachmentReference*		pInputAttachments;
		1u,												// deUint32							colorAttachmentCount;
		&colorAttachmentReference,						// const VkAttachmentReference*		pColorAttachments;
		DE_NULL,										// const VkAttachmentReference*		pResolveAttachments;
		&depthAttachmentReference,						// const VkAttachmentReference*		pDepthStencilAttachment;
		0u,												// deUint32							preserveAttachmentCount;
		DE_NULL											// const deUint32*					pPreserveAttachments;
	};

	const VkRenderPassCreateInfo renderPassInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,		// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		(VkRenderPassCreateFlags)0,						// VkRenderPassCreateFlags			flags;
		1u,												// deUint32							attachmentCount;
		&colorAttachmentDescription,					// const VkAttachmentDescription*	pAttachments;
		1u,												// deUint32							subpassCount;
		&subpassDescription,							// const VkSubpassDescription*		pSubpasses;
		0u,												// deUint32							dependencyCount;
		DE_NULL											// const VkSubpassDependency*		pDependencies;
	};

	return createRenderPass(vk, device, &renderPassInfo);
}